

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Doctors_Timetable_Setter(Hospital *this,int day,int time,string *last_name)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,"    ",last_name);
  std::operator+(&local_40,&local_60,"    ");
  std::__cxx11::string::operator=
            ((string *)
             (Doctors_Timetable_abi_cxx11_.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[day].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + time),(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"Doctor s on-call shift added !!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Hospital :: Doctors_Timetable_Setter(int day , int time ,string last_name) {

    Doctors_Timetable[day][time] = "    " + last_name + "    ";
    cout << "Doctor s on-call shift added !!"<<endl;
}